

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiScene * __thiscall
Assimp::Importer::ApplyCustomizedPostProcessing
          (Importer *this,BaseProcess *rootProcess,bool requestValidation)

{
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_> this_00
  ;
  int iVar1;
  Logger *pLVar2;
  __uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
  this_01;
  ImporterPimpl *pIVar3;
  aiScene *paVar4;
  allocator<char> local_49;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  ValidateDSProcess ds;
  
  paVar4 = this->pimpl->mScene;
  if (paVar4 == (aiScene *)0x0) {
LAB_0039ec00:
    paVar4 = (aiScene *)0x0;
  }
  else {
    if (rootProcess == (BaseProcess *)0x0) {
      return paVar4;
    }
    pLVar2 = DefaultLogger::get();
    Logger::info(pLVar2,"Entering customized post processing pipeline");
    if (requestValidation) {
      ValidateDSProcess::ValidateDSProcess(&ds);
      BaseProcess::ExecuteOnScene(&ds.super_BaseProcess,this);
      paVar4 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess(&ds);
      if (paVar4 == (aiScene *)0x0) goto LAB_0039ec00;
    }
    iVar1 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
    if (iVar1 == 0) {
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
            )(__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              )0x0;
    }
    else {
      this_01.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            )operator_new(0x30);
      (((_Rb_tree_header *)
       ((long)this_01.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8))->
      _M_header)._M_color = _S_red;
      *(_Base_ptr *)
       ((long)this_01.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x10) =
           (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)this_01.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x18) =
           (_Base_ptr)
           ((long)this_01.
                  super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                  .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8);
      *(_Base_ptr *)
       ((long)this_01.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x20) =
           (_Base_ptr)
           ((long)this_01.
                  super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                  .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8);
      *(size_t *)
       ((long)this_01.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x28) = 0;
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
            )(__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
              )this_01.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>((string *)&ds,"postprocess",&local_49);
      Profiling::Profiler::BeginRegion
                ((Profiler *)
                 this_01.
                 super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                 .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                 (string *)&ds);
      std::__cxx11::string::~string((string *)&ds);
    }
    BaseProcess::ExecuteOnScene(rootProcess,this);
    this_00 = profiler;
    if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
         )profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
         )0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&ds,"postprocess",&local_49);
      Profiling::Profiler::EndRegion
                ((Profiler *)
                 this_00._M_t.
                 super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                 .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                 (string *)&ds);
      std::__cxx11::string::~string((string *)&ds);
    }
    pIVar3 = this->pimpl;
    if ((requestValidation | pIVar3->bExtraVerbose) == 1) {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"Verbose Import: revalidating data structures");
      ValidateDSProcess::ValidateDSProcess(&ds);
      BaseProcess::ExecuteOnScene(&ds.super_BaseProcess,this);
      if (this->pimpl->mScene == (aiScene *)0x0) {
        pLVar2 = DefaultLogger::get();
        Logger::error(pLVar2,"Verbose Import: failed to revalidate data structures");
      }
      ValidateDSProcess::~ValidateDSProcess(&ds);
      pIVar3 = this->pimpl;
    }
    SharedPostProcessInfo::Clean(pIVar3->mPPShared);
    pLVar2 = DefaultLogger::get();
    Logger::info(pLVar2,"Leaving customized post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr(&profiler);
    paVar4 = this->pimpl->mScene;
  }
  return paVar4;
}

Assistant:

const aiScene* Importer::ApplyCustomizedPostProcessing( BaseProcess *rootProcess, bool requestValidation ) {
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // Return immediately if no scene is active
    if ( NULL == pimpl->mScene ) {
        return NULL;
    }

    // If no flags are given, return the current scene with no further action
    if ( NULL == rootProcess ) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ASSIMP_LOG_INFO( "Entering customized post processing pipeline" );

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if ( requestValidation )
    {
        ValidateDSProcess ds;
        ds.ExecuteOnScene( this );
        if ( !pimpl->mScene ) {
            return NULL;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if ( pimpl->bExtraVerbose )
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR( "Verbose Import is not available due to build settings" );
#endif  // no validation
    }
#else
    if ( pimpl->bExtraVerbose ) {
        ASSIMP_LOG_WARN( "Not a debug build, ignoring extra verbose setting" );
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler( GetPropertyInteger( AI_CONFIG_GLOB_MEASURE_TIME, 0 ) ? new Profiler() : NULL );

    if ( profiler ) {
        profiler->BeginRegion( "postprocess" );
    }

    rootProcess->ExecuteOnScene( this );

    if ( profiler ) {
        profiler->EndRegion( "postprocess" );
    }

    // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
    if ( pimpl->bExtraVerbose || requestValidation  ) {
        ASSIMP_LOG_DEBUG( "Verbose Import: revalidating data structures" );

        ValidateDSProcess ds;
        ds.ExecuteOnScene( this );
        if ( !pimpl->mScene ) {
            ASSIMP_LOG_ERROR( "Verbose Import: failed to revalidate data structures" );
        }
    }

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO( "Leaving customized post processing pipeline" );

    ASSIMP_END_EXCEPTION_REGION( const aiScene* );

    return pimpl->mScene;
}